

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix.cpp
# Opt level: O2

void duckdb::Prefix::Free(ART *art,Node *node)

{
  FixedSizeAllocator *this;
  IndexPointer ptr_p;
  Prefix prefix;
  
  ptr_p.data = (node->super_IndexPointer).data;
  while ((ptr_p.data & 0x7f00000000000000) == 0x100000000000000) {
    Prefix(&prefix,art,(Node)ptr_p.data,true,false);
    ptr_p.data = ((prefix.ptr)->super_IndexPointer).data;
    this = Node::GetAllocator(art,PREFIX);
    FixedSizeAllocator::Free(this,(IndexPointer)(node->super_IndexPointer).data);
    (node->super_IndexPointer).data = ptr_p.data;
  }
  Node::Free(art,node);
  (node->super_IndexPointer).data = 0;
  return;
}

Assistant:

void Prefix::Free(ART &art, Node &node) {
	Node next;

	while (node.HasMetadata() && node.GetType() == PREFIX) {
		Prefix prefix(art, node, true);
		next = *prefix.ptr;
		Node::GetAllocator(art, PREFIX).Free(node);
		node = next;
	}

	Node::Free(art, node);
	node.Clear();
}